

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformservices.cpp
# Opt level: O3

bool __thiscall QPlatformServices::openDocument(QPlatformServices *this,QUrl *url)

{
  long in_FS_OFFSET;
  QArrayData *local_60;
  longlong local_58;
  QArrayData *local_48;
  undefined8 *local_40;
  char local_30 [24];
  char *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_30[0] = '\x02';
  local_30[1] = '\0';
  local_30[2] = '\0';
  local_30[3] = '\0';
  local_30[0x14] = '\0';
  local_30[0x15] = '\0';
  local_30[0x16] = '\0';
  local_30[0x17] = '\0';
  local_30[4] = '\0';
  local_30[5] = '\0';
  local_30[6] = '\0';
  local_30[7] = '\0';
  local_30[8] = '\0';
  local_30[9] = '\0';
  local_30[10] = '\0';
  local_30[0xb] = '\0';
  local_30[0xc] = '\0';
  local_30[0xd] = '\0';
  local_30[0xe] = '\0';
  local_30[0xf] = '\0';
  local_30[0x10] = '\0';
  local_30[0x11] = '\0';
  local_30[0x12] = '\0';
  local_30[0x13] = '\0';
  local_18 = "default";
  QUrl::toString(&local_60,url,0);
  QString::toLocal8Bit_helper((QChar *)&local_48,local_58);
  if (local_40 == (undefined8 *)0x0) {
    local_40 = &QByteArray::_empty;
  }
  QMessageLogger::warning
            (local_30,"This plugin does not support QPlatformServices::openDocument() for \'%s\'.",
             local_40);
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48,1,0x10);
    }
  }
  if (local_60 != (QArrayData *)0x0) {
    LOCK();
    (local_60->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_60->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_60->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_60,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return false;
  }
  __stack_chk_fail();
}

Assistant:

bool QPlatformServices::openDocument(const QUrl &url)
{
    qWarning("This plugin does not support QPlatformServices::openDocument() for '%s'.",
             qPrintable(url.toString()));
    return false;
}